

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_widget_layout_states nk_widget_fitting(nk_rect *bounds,nk_context *ctx,nk_vec2 item_padding)

{
  int iVar1;
  nk_panel *pnVar2;
  nk_vec2 nVar3;
  nk_widget_layout_states nVar4;
  float fVar5;
  float fVar6;
  float local_38;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x4a17,
                  "enum nk_widget_layout_states nk_widget_fitting(struct nk_rect *, struct nk_context *, struct nk_vec2)"
                 );
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x4a18,
                  "enum nk_widget_layout_states nk_widget_fitting(struct nk_rect *, struct nk_context *, struct nk_vec2)"
                 );
  }
  pnVar2 = ctx->current->layout;
  if (pnVar2 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x4a19,
                  "enum nk_widget_layout_states nk_widget_fitting(struct nk_rect *, struct nk_context *, struct nk_vec2)"
                 );
  }
  nVar4 = nk_widget(bounds,ctx);
  nVar3 = nk_panel_get_padding(&ctx->style,pnVar2->type);
  fVar5 = nVar3.x;
  iVar1 = (pnVar2->row).index;
  local_38 = item_padding.x;
  fVar6 = local_38;
  if (iVar1 == 1) {
    bounds->w = bounds->w + fVar5;
    fVar6 = fVar5;
  }
  bounds->x = bounds->x - fVar6;
  if (iVar1 != (pnVar2->row).columns) {
    fVar5 = local_38;
  }
  bounds->w = fVar5 + bounds->w;
  return nVar4;
}

Assistant:

NK_API enum nk_widget_layout_states
nk_widget_fitting(struct nk_rect *bounds, struct nk_context *ctx,
    struct nk_vec2 item_padding)
{
    /* update the bounds to stand without padding  */
    struct nk_window *win;
    struct nk_style *style;
    struct nk_panel *layout;
    enum nk_widget_layout_states state;
    struct nk_vec2 panel_padding;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return NK_WIDGET_INVALID;

    win = ctx->current;
    style = &ctx->style;
    layout = win->layout;
    state = nk_widget(bounds, ctx);

    panel_padding = nk_panel_get_padding(style, layout->type);
    if (layout->row.index == 1) {
        bounds->w += panel_padding.x;
        bounds->x -= panel_padding.x;
    } else bounds->x -= item_padding.x;

    if (layout->row.index == layout->row.columns)
        bounds->w += panel_padding.x;
    else bounds->w += item_padding.x;
    return state;
}